

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O1

void re2::Parse3OnePass(int iters,char *regexp,StringPiece *text)

{
  bool bVar1;
  undefined4 uVar2;
  Regexp *this;
  Prog *this_00;
  long lVar4;
  int iVar5;
  StringPiece sp [4];
  StringPiece local_1f8 [4];
  char *local_1b0;
  ostream local_1a8 [376];
  size_t sVar3;
  
  if (0 < iters) {
    iVar5 = 0;
    do {
      uVar2._0_1_ = (ostringstream)0x0;
      uVar2._1_3_ = 0;
      local_1b0 = regexp;
      if (regexp != (char *)0x0) {
        sVar3 = strlen(regexp);
        uVar2 = (undefined4)sVar3;
      }
      local_1a8._0_4_ = uVar2;
      this = Regexp::Parse((StringPiece *)&local_1b0,LikePerl,(RegexpStatus *)0x0);
      if (this == (Regexp *)0x0) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x429,3);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Check failed: re",0x10);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      this_00 = Regexp::CompileToProg(this,0);
      if (this_00 == (Prog *)0x0) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x42b,3);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Check failed: prog",0x12);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      bVar1 = Prog::IsOnePass(this_00);
      if (!bVar1) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x42c,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Check failed: prog->IsOnePass()",0x1f);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      lVar4 = 0;
      do {
        *(undefined8 *)((long)&local_1f8[0].ptr_ + lVar4) = 0;
        *(undefined4 *)((long)&local_1f8[0].length_ + lVar4) = 0;
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x40);
      bVar1 = Prog::SearchOnePass(this_00,text,text,kAnchored,kFullMatch,local_1f8,4);
      if (!bVar1) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x42e,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,
                   "Check failed: prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4)"
                   ,0x57);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      Prog::~Prog(this_00);
      operator_delete(this_00);
      Regexp::Decref(this);
      iVar5 = iVar5 + 1;
    } while (iVar5 != iters);
  }
  return;
}

Assistant:

void Parse3OnePass(int iters, const char* regexp, const StringPiece& text) {
  for (int i = 0; i < iters; i++) {
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    CHECK(prog->IsOnePass());
    StringPiece sp[4];  // 4 because sp[0] is whole match.
    CHECK(prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4));
    delete prog;
    re->Decref();
  }
}